

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O3

wchar_t lzh_br_fillup(lzh_stream *strm,lzh_br *br)

{
  uint64_t uVar1;
  byte *pbVar2;
  ulong uVar3;
  int iVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  ulong *puVar7;
  int iVar8;
  wchar_t wVar9;
  int iVar10;
  
  wVar6 = br->cache_avail;
  wVar5 = strm->avail_in;
  iVar4 = -wVar6;
  while( true ) {
    wVar6 = wVar6 + L'\b';
    wVar9 = iVar4 + 0x40 >> 3;
    if (wVar9 <= wVar5) break;
switchD_00573916_caseD_1:
    if (wVar5 == L'\0') {
      return L'\0';
    }
    uVar1 = br->cache_buffer;
    pbVar2 = strm->next_in;
    strm->next_in = pbVar2 + 1;
    br->cache_buffer = (ulong)*pbVar2 | uVar1 << 8;
    wVar5 = wVar5 + L'\xffffffff';
    strm->avail_in = wVar5;
    br->cache_avail = wVar6;
    iVar4 = iVar4 + -8;
  }
  switch(wVar9) {
  case L'\0':
    goto switchD_00573916_caseD_0;
  default:
    goto switchD_00573916_caseD_1;
  case L'\x06':
    pbVar2 = strm->next_in;
    br->cache_buffer =
         (ulong)pbVar2[5] |
         (ulong)pbVar2[4] << 8 |
         (ulong)pbVar2[3] << 0x10 |
         (ulong)pbVar2[2] << 0x18 |
         (ulong)pbVar2[1] << 0x20 | (ulong)*pbVar2 << 0x28 | br->cache_buffer << 0x30;
    puVar7 = (ulong *)(pbVar2 + 6);
    iVar8 = 0x30;
    iVar10 = -6;
    break;
  case L'\a':
    pbVar2 = strm->next_in;
    br->cache_buffer =
         (ulong)pbVar2[6] |
         (ulong)pbVar2[5] << 8 |
         (ulong)pbVar2[4] << 0x10 |
         (ulong)pbVar2[3] << 0x18 |
         (ulong)pbVar2[2] << 0x20 |
         (ulong)pbVar2[1] << 0x28 | (ulong)*pbVar2 << 0x30 | br->cache_buffer << 0x38;
    puVar7 = (ulong *)(pbVar2 + 7);
    iVar8 = 0x38;
    iVar10 = -7;
    break;
  case L'\b':
    puVar7 = (ulong *)strm->next_in;
    uVar3 = *puVar7;
    br->cache_buffer =
         uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    puVar7 = puVar7 + 1;
    iVar8 = 0x40;
    iVar10 = -8;
  }
  strm->next_in = (uchar *)puVar7;
  strm->avail_in = iVar10 + wVar5;
  br->cache_avail = iVar8 - iVar4;
switchD_00573916_caseD_0:
  return L'\x01';
}

Assistant:

static int
lzh_br_fillup(struct lzh_stream *strm, struct lzh_br *br)
{
	int n = CACHE_BITS - br->cache_avail;

	for (;;) {
		const int x = n >> 3;
		if (strm->avail_in >= x) {
			switch (x) {
			case 8:
				br->cache_buffer =
				    ((uint64_t)strm->next_in[0]) << 56 |
				    ((uint64_t)strm->next_in[1]) << 48 |
				    ((uint64_t)strm->next_in[2]) << 40 |
				    ((uint64_t)strm->next_in[3]) << 32 |
				    ((uint32_t)strm->next_in[4]) << 24 |
				    ((uint32_t)strm->next_in[5]) << 16 |
				    ((uint32_t)strm->next_in[6]) << 8 |
				     (uint32_t)strm->next_in[7];
				strm->next_in += 8;
				strm->avail_in -= 8;
				br->cache_avail += 8 * 8;
				return (1);
			case 7:
				br->cache_buffer =
		 		   (br->cache_buffer << 56) |
				    ((uint64_t)strm->next_in[0]) << 48 |
				    ((uint64_t)strm->next_in[1]) << 40 |
				    ((uint64_t)strm->next_in[2]) << 32 |
				    ((uint32_t)strm->next_in[3]) << 24 |
				    ((uint32_t)strm->next_in[4]) << 16 |
				    ((uint32_t)strm->next_in[5]) << 8 |
				     (uint32_t)strm->next_in[6];
				strm->next_in += 7;
				strm->avail_in -= 7;
				br->cache_avail += 7 * 8;
				return (1);
			case 6:
				br->cache_buffer =
		 		   (br->cache_buffer << 48) |
				    ((uint64_t)strm->next_in[0]) << 40 |
				    ((uint64_t)strm->next_in[1]) << 32 |
				    ((uint32_t)strm->next_in[2]) << 24 |
				    ((uint32_t)strm->next_in[3]) << 16 |
				    ((uint32_t)strm->next_in[4]) << 8 |
				     (uint32_t)strm->next_in[5];
				strm->next_in += 6;
				strm->avail_in -= 6;
				br->cache_avail += 6 * 8;
				return (1);
			case 0:
				/* We have enough compressed data in
				 * the cache buffer.*/
				return (1);
			default:
				break;
			}
		}
		if (strm->avail_in == 0) {
			/* There is not enough compressed data to fill up the
			 * cache buffer. */
			return (0);
		}
		br->cache_buffer =
		   (br->cache_buffer << 8) | *strm->next_in++;
		strm->avail_in--;
		br->cache_avail += 8;
		n -= 8;
	}
}